

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_table.c
# Opt level: O1

void com_dct_coef_init(void)

{
  ulong uVar1;
  double dVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  s8 *psVar8;
  s8 *psVar9;
  s8 *psVar10;
  ulong uVar11;
  s8 *psVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double __x;
  double dVar17;
  double __x_00;
  double dVar18;
  double __x_01;
  double w0;
  
  psVar9 = g_tbl_itrans_coeffs;
  uVar7 = 2;
  lVar4 = 0;
  do {
    iVar5 = (int)uVar7;
    __x = (double)iVar5;
    if (__x < 0.0) {
      dVar17 = sqrt(__x);
    }
    else {
      dVar17 = SQRT(__x);
    }
    dVar17 = dVar17 * 32.0;
    __x_00 = 2.0 / __x;
    dVar18 = __x + 0.5;
    __x_01 = 2.0 / dVar18;
    uVar6 = iVar5 * iVar5;
    psVar12 = psVar9 + uVar6 * 2;
    psVar8 = psVar9 + uVar6;
    uVar3 = 0;
    psVar10 = psVar9;
    do {
      dVar2 = *(double *)(&DAT_0015eae8 + (ulong)(uVar3 == 0) * 8);
      dVar13 = ((double)(int)uVar3 + 0.5) * 3.141592653589793;
      uVar11 = 0;
      do {
        dVar14 = (double)(int)uVar11 + 0.5;
        dVar15 = cos((dVar14 * 3.141592653589793 * (double)(int)uVar3) / __x);
        dVar16 = SQRT(__x_00);
        if (__x_00 < 0.0) {
          dVar16 = sqrt(__x_00);
        }
        dVar16 = dVar15 * dVar2 * dVar16;
        psVar10[uVar11] =
             (s8)(int)(dVar16 * dVar17 + *(double *)(&DAT_0015eaf8 + (ulong)(0.0 < dVar16) * 8));
        dVar14 = cos((dVar14 * dVar13) / dVar18);
        dVar16 = SQRT(__x_01);
        if (__x_01 < 0.0) {
          dVar16 = sqrt(__x_01);
        }
        psVar8[uVar11] =
             (s8)(int)(dVar14 * dVar16 * dVar17 +
                      *(double *)(&DAT_0015eaf8 + (ulong)(0.0 < dVar14 * dVar16) * 8));
        uVar1 = uVar11 + 1;
        dVar14 = sin(((double)(int)uVar1 * dVar13) / dVar18);
        dVar16 = SQRT(__x_01);
        if (__x_01 < 0.0) {
          dVar16 = sqrt(__x_01);
        }
        psVar12[uVar11] =
             (s8)(int)(dVar14 * dVar16 * dVar17 +
                      *(double *)(&DAT_0015eaf8 + (ulong)(0.0 < dVar14 * dVar16) * 8));
        uVar11 = uVar1;
      } while (uVar7 != uVar1);
      uVar3 = uVar3 + 1;
      psVar12 = psVar12 + uVar7;
      psVar8 = psVar8 + uVar7;
      psVar10 = psVar10 + uVar7;
    } while (uVar3 != uVar7);
    g_tbl_itrans[0][lVar4] = psVar9;
    g_tbl_itrans[1][lVar4] = psVar9 + uVar6;
    g_tbl_itrans[2][lVar4] = psVar9 + iVar5 * iVar5 * 2;
    psVar9 = psVar9 + (int)(uVar6 * 3);
    lVar4 = lVar4 + 1;
    uVar7 = (ulong)(uint)(iVar5 * 2);
  } while (lVar4 != 6);
  return;
}

Assistant:

void com_dct_coef_init()
{
    int i, blk_size = 2;
    const double PI = 3.14159265358979323846;
    s8 *coeffs = g_tbl_itrans_coeffs;

    for (i = 0; i < 6; i++) {
        const double s = sqrt((double)blk_size) * 32;

        for (int k = 0; k < blk_size; k++) {
            for (int n = 0; n < blk_size; n++) {
                double w0, v;
                
                // DCT2
                w0 = k == 0 ? sqrt(0.5) : 1;
                v = cos(PI * (n + 0.5) * k / blk_size) * w0 * sqrt(2.0 / blk_size);
                coeffs[DCT2 * blk_size * blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));
                
                // DCT8
                v = cos(PI*(k + 0.5)*(n + 0.5) / (blk_size + 0.5)) * sqrt(2.0 / (blk_size + 0.5));
                coeffs[DCT8*blk_size*blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));

                // DST7
                v = sin(PI*(k + 0.5)*(n + 1) / (blk_size + 0.5)) * sqrt(2.0 / (blk_size + 0.5));
                coeffs[DST7*blk_size*blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));

            }
        }
        
        g_tbl_itrans[DCT2][i] = coeffs;
        g_tbl_itrans[DCT8][i] = coeffs + DCT8*blk_size*blk_size;
        g_tbl_itrans[DST7][i] = coeffs + DST7*blk_size*blk_size;

        coeffs += NUM_TRANS_TYPE * blk_size*blk_size;

        blk_size <<= 1;
    }
}